

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  ushort uVar1;
  stbi__uint32 sVar2;
  bool bVar3;
  undefined8 uVar4;
  stbi_uc sVar5;
  byte bVar6;
  uchar uVar7;
  int iVar8;
  uint uVar9;
  stbi__uint32 sVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  void *pvVar18;
  stbi__context *data;
  stbi__uint16 *psVar19;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar20;
  byte *pbVar21;
  uchar *puVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  stbi__uint16 *psVar28;
  int iVar29;
  ulong uVar30;
  undefined4 in_register_00000084;
  stbi_uc *two_back;
  stbi__result_info *ri_00;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  long in_FS_OFFSET;
  bool bVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  stbi_uc pal [256] [4];
  uint local_895c;
  stbi__uint16 *local_8950;
  stbi__uint16 *local_8918;
  uint local_88e4;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  two_back = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  iVar8 = stbi__check_png_header(s);
  psVar20 = s->img_buffer_original;
  s->img_buffer = psVar20;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar8 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar8 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      psVar19 = (stbi__uint16 *)local_88a8.history;
      uVar4 = local_88a8._0_8_;
      psVar28 = (stbi__uint16 *)0x0;
      if (iVar8 != 0) {
        iVar8 = 8;
        if ((8 < local_88a8.flags) && (iVar8 = 0x10, local_88a8.flags != 0x10)) {
          pcVar17 = "bad bits_per_channel";
          goto LAB_00125051;
        }
        ri->bits_per_channel = iVar8;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar8 = *(int *)(local_88a8._0_8_ + 0xc), iVar8 != req_comp)) {
          if (local_88a8.flags < 9) {
            psVar19 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)psVar19,iVar8,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            psVar19 = stbi__convert_format16
                                (psVar19,iVar8,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar4 + 0xc) = req_comp;
          if (psVar19 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar28 = psVar19;
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar28;
    }
    pcVar17 = "bad req_comp";
    goto LAB_00125051;
  }
  if (psVar20 < s->img_buffer_original_end) {
LAB_0012508c:
    s->img_buffer = psVar20 + 1;
    if (*psVar20 != 'B') goto LAB_00125205;
    psVar20 = s->img_buffer;
    if (s->img_buffer_end <= psVar20) {
      if (s->read_from_callbacks == 0) goto LAB_00125205;
      stbi__refill_buffer(s);
      psVar20 = s->img_buffer;
    }
    s->img_buffer = psVar20 + 1;
    if (*psVar20 != 'M') goto LAB_00125205;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar9 = stbi__get16le(s);
    iVar8 = stbi__get16le(s);
    uVar9 = iVar8 << 0x10 | uVar9;
    if ((((0x38 < uVar9) || ((0x100010000001000U >> ((ulong)uVar9 & 0x3f) & 1) == 0)) &&
        (uVar9 != 0x7c)) && (uVar9 != 0x6c)) goto LAB_00125205;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    local_88cc.all_a = 0xff;
    pvVar18 = stbi__bmp_parse_header(s,&local_88cc);
    local_8918._0_4_ = local_88cc.all_a;
    if (pvVar18 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar9 = s->img_y;
    uVar27 = -uVar9;
    if (0 < (int)uVar9) {
      uVar27 = uVar9;
    }
    s->img_y = uVar27;
    if ((uVar27 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88cc.hsz == 0xc) {
        if (local_88cc.bpp < 0x18) {
          uVar30 = (ulong)(uint)(((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3);
        }
        else {
LAB_001256b2:
          uVar30 = 0;
        }
      }
      else {
        if (0xf < local_88cc.bpp) goto LAB_001256b2;
        uVar30 = (ulong)(uint)(local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2);
      }
      iVar8 = (int)uVar30;
      if (iVar8 == 0) {
        iVar12 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar12 - 0x401U < 0xfffffc00) {
          pcVar17 = "bad header";
          goto LAB_00125051;
        }
        if ((local_88cc.offset < iVar12) || (0x400 < local_88cc.offset - iVar12)) {
          pcVar17 = "bad offset";
          goto LAB_00125051;
        }
        stbi__skip(s,local_88cc.offset - iVar12);
      }
      uVar27 = local_88cc.ma ^ 0xff000000;
      s->img_n = 4 - (uint)(local_88cc.ma == 0 || local_88cc.bpp == 0x18 && uVar27 == 0);
      iVar12 = req_comp;
      if (req_comp < 3) {
        iVar12 = s->img_n;
      }
      sVar10 = s->img_x;
      sVar2 = s->img_y;
      iVar11 = stbi__mad3sizes_valid(iVar12,sVar10,sVar2,0);
      if (iVar11 == 0) goto LAB_00125c9a;
      data_00 = (uchar *)stbi__malloc_mad3(iVar12,sVar10,sVar2,0);
      if (data_00 != (uchar *)0x0) {
        if (local_88cc.bpp < 0x10) {
          if (iVar8 < 0x101 && iVar8 != 0) {
            if (0 < iVar8) {
              uVar32 = 0;
              do {
                psVar20 = s->img_buffer;
                if (psVar20 < s->img_buffer_end) {
LAB_00125940:
                  s->img_buffer = psVar20 + 1;
                  sVar5 = *psVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar20 = s->img_buffer;
                    goto LAB_00125940;
                  }
                  sVar5 = '\0';
                }
                local_88a8.pal[uVar32 - 0xd][2] = sVar5;
                psVar20 = s->img_buffer;
                if (psVar20 < s->img_buffer_end) {
LAB_00125984:
                  s->img_buffer = psVar20 + 1;
                  sVar5 = *psVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar20 = s->img_buffer;
                    goto LAB_00125984;
                  }
                  sVar5 = '\0';
                }
                local_88a8.pal[uVar32 - 0xd][1] = sVar5;
                psVar20 = s->img_buffer;
                if (psVar20 < s->img_buffer_end) {
LAB_001259c8:
                  s->img_buffer = psVar20 + 1;
                  sVar5 = *psVar20;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar20 = s->img_buffer;
                    goto LAB_001259c8;
                  }
                  sVar5 = '\0';
                }
                local_88a8.pal[uVar32 - 0xd][0] = sVar5;
                if (local_88cc.hsz != 0xc) {
                  psVar20 = s->img_buffer;
                  if (s->img_buffer_end <= psVar20) {
                    if (s->read_from_callbacks == 0) goto LAB_00125a18;
                    stbi__refill_buffer(s);
                    psVar20 = s->img_buffer;
                  }
                  s->img_buffer = psVar20 + 1;
                }
LAB_00125a18:
                local_88a8.pal[uVar32 - 0xd][3] = 0xff;
                uVar32 = uVar32 + 1;
              } while (uVar30 != uVar32);
            }
            stbi__skip(s,(iVar8 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (local_88cc.bpp == 8) {
              uVar27 = s->img_x;
            }
            else if (local_88cc.bpp == 4) {
              uVar27 = s->img_x + 1 >> 1;
            }
            else {
              if (local_88cc.bpp != 1) {
                free(data_00);
                pcVar17 = "bad bpp";
                goto LAB_00125051;
              }
              uVar27 = s->img_x + 7 >> 3;
            }
            if (local_88cc.bpp == 1) {
              if (0 < (int)s->img_y) {
                iVar8 = 0;
                iVar11 = 0;
                do {
                  pbVar21 = s->img_buffer;
                  if (pbVar21 < s->img_buffer_end) {
LAB_00125d0f:
                    s->img_buffer = pbVar21 + 1;
                    uVar26 = (uint)*pbVar21;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar21 = s->img_buffer;
                      goto LAB_00125d0f;
                    }
                    uVar26 = 0;
                  }
                  uVar24 = 7;
                  sVar10 = 1;
                  do {
                    sVar2 = s->img_x;
                    if ((int)sVar2 <= (int)(sVar10 - 1)) break;
                    uVar30 = (ulong)((uVar26 >> (uVar24 & 0x1f) & 1) != 0);
                    data_00[iVar8] = local_88a8.pal[uVar30 - 0xd][0];
                    data_00[(long)iVar8 + 1] = local_88a8.pal[uVar30 - 0xd][1];
                    data_00[(long)iVar8 + 2] = local_88a8.pal[uVar30 - 0xd][2];
                    iVar14 = iVar8 + 3;
                    if (iVar12 == 4) {
                      data_00[(long)iVar8 + 3] = 0xff;
                      iVar14 = iVar8 + 4;
                    }
                    iVar8 = iVar14;
                    if (sVar10 != sVar2) {
                      if ((int)uVar24 < 1) {
                        pbVar21 = s->img_buffer;
                        if (pbVar21 < s->img_buffer_end) {
LAB_00125dc0:
                          s->img_buffer = pbVar21 + 1;
                          uVar26 = (uint)*pbVar21;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar21 = s->img_buffer;
                            goto LAB_00125dc0;
                          }
                          uVar26 = 0;
                        }
                        uVar24 = 7;
                      }
                      else {
                        uVar24 = uVar24 - 1;
                      }
                    }
                    bVar35 = sVar10 != sVar2;
                    sVar10 = sVar10 + 1;
                  } while (bVar35);
                  stbi__skip(s,-uVar27 & 3);
                  iVar11 = iVar11 + 1;
                } while (iVar11 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar30 = 0;
              iVar8 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar11 = 0;
                  do {
                    pbVar21 = s->img_buffer;
                    if (pbVar21 < s->img_buffer_end) {
LAB_00125e78:
                      s->img_buffer = pbVar21 + 1;
                      uVar26 = (uint)*pbVar21;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar21 = s->img_buffer;
                        goto LAB_00125e78;
                      }
                      uVar26 = 0;
                    }
                    uVar24 = uVar26 >> 4;
                    if (local_88cc.bpp != 4) {
                      uVar24 = uVar26;
                    }
                    uVar32 = (ulong)uVar24;
                    uVar26 = uVar26 & 0xf;
                    if (local_88cc.bpp != 4) {
                      uVar26 = 0;
                    }
                    lVar23 = (long)(int)uVar30;
                    uVar31 = lVar23 + 3;
                    data_00[lVar23] = local_88a8.pal[uVar32 - 0xd][0];
                    data_00[lVar23 + 1] = local_88a8.pal[uVar32 - 0xd][1];
                    data_00[lVar23 + 2] = local_88a8.pal[uVar32 - 0xd][2];
                    if (iVar12 == 4) {
                      data_00[lVar23 + 3] = 0xff;
                      uVar31 = (ulong)((int)uVar30 + 4);
                    }
                    sVar10 = s->img_x;
                    if (iVar11 + 1U == sVar10) {
LAB_00125f76:
                      uVar30 = uVar31 & 0xffffffff;
                    }
                    else {
                      if (local_88cc.bpp == 8) {
                        pbVar21 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar21) {
                          if (s->read_from_callbacks == 0) {
                            uVar26 = 0;
                            goto LAB_00125f39;
                          }
                          stbi__refill_buffer(s);
                          pbVar21 = s->img_buffer;
                        }
                        s->img_buffer = pbVar21 + 1;
                        uVar26 = (uint)*pbVar21;
                      }
LAB_00125f39:
                      lVar23 = (long)(int)uVar31;
                      uVar30 = lVar23 + 3;
                      uVar32 = (ulong)uVar26;
                      data_00[lVar23] = local_88a8.pal[uVar32 - 0xd][0];
                      data_00[lVar23 + 1] = local_88a8.pal[uVar32 - 0xd][1];
                      data_00[lVar23 + 2] = local_88a8.pal[uVar32 - 0xd][2];
                      if (iVar12 == 4) {
                        uVar31 = (ulong)((int)uVar31 + 4);
                        data_00[lVar23 + 3] = 0xff;
                        goto LAB_00125f76;
                      }
                    }
                  } while ((iVar11 + 1U != sVar10) && (iVar11 = iVar11 + 2, iVar11 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,-uVar27 & 3);
                iVar8 = iVar8 + 1;
              } while (iVar8 < (int)s->img_y);
            }
            goto LAB_001262ab;
          }
          free(data_00);
          pcVar17 = "invalid";
          goto LAB_00125051;
        }
        stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
        if (local_88cc.bpp == 0x18) {
          iVar8 = -3;
LAB_00125acd:
          uVar26 = iVar8 * s->img_x & 3;
        }
        else {
          uVar26 = 0;
          if (local_88cc.bpp == 0x10) {
            iVar8 = -2;
            goto LAB_00125acd;
          }
        }
        if (local_88cc.bpp == 0x18) {
          bVar35 = false;
LAB_00125b11:
          bVar34 = false;
        }
        else {
          if (local_88cc.bpp != 0x20) {
            bVar35 = true;
            goto LAB_00125b11;
          }
          bVar34 = (local_88cc.mr == 0xff0000 && (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff))
                   && uVar27 == 0;
          bVar35 = (local_88cc.mr != 0xff0000 || (local_88cc.mg != 0xff00 || local_88cc.mb != 0xff))
                   || uVar27 != 0;
        }
        iVar8 = 0;
        iVar13 = 0;
        iVar11 = 0;
        iVar14 = 0;
        local_895c = 0;
        uVar27 = 0;
        uVar24 = 0;
        local_88e4 = 0;
        if (bVar35) {
          if (local_88cc.mb != 0 && (local_88cc.mg != 0 && local_88cc.mr != 0)) {
            iVar8 = stbi__high_bit(local_88cc.mr);
            local_895c = stbi__bitcount(local_88cc.mr);
            iVar13 = stbi__high_bit(local_88cc.mg);
            uVar27 = stbi__bitcount(local_88cc.mg);
            iVar11 = stbi__high_bit(local_88cc.mb);
            uVar24 = stbi__bitcount(local_88cc.mb);
            iVar14 = stbi__high_bit(local_88cc.ma);
            local_88e4 = stbi__bitcount(local_88cc.ma);
            if ((local_88e4 < 9 && uVar24 < 9) && (uVar27 < 9 && local_895c < 9)) {
              iVar8 = iVar8 + -7;
              iVar13 = iVar13 + -7;
              iVar11 = iVar11 + -7;
              iVar14 = iVar14 + -7;
              goto LAB_00125ff5;
            }
          }
          free(data_00);
          *(char **)(in_FS_OFFSET + -0x20) = "bad masks";
          bVar3 = false;
        }
        else {
LAB_00125ff5:
          bVar3 = true;
          if (0 < (int)s->img_y) {
            iVar29 = 0;
            iVar25 = 0;
            do {
              if (bVar35) {
                if (0 < (int)s->img_x) {
                  iVar33 = 0;
                  do {
                    uVar15 = stbi__get16le(s);
                    if (local_88cc.bpp != 0x10) {
                      iVar16 = stbi__get16le(s);
                      uVar15 = uVar15 | iVar16 << 0x10;
                    }
                    iVar16 = stbi__shiftsigned(uVar15 & local_88cc.mr,iVar8,local_895c);
                    data_00[iVar29] = (uchar)iVar16;
                    iVar16 = stbi__shiftsigned(uVar15 & local_88cc.mg,iVar13,uVar27);
                    data_00[(long)iVar29 + 1] = (uchar)iVar16;
                    iVar16 = stbi__shiftsigned(uVar15 & local_88cc.mb,iVar11,uVar24);
                    data_00[(long)iVar29 + 2] = (uchar)iVar16;
                    if (local_88cc.ma == 0) {
                      uVar15 = 0xff;
                    }
                    else {
                      uVar15 = stbi__shiftsigned(uVar15 & local_88cc.ma,iVar14,local_88e4);
                    }
                    iVar16 = iVar29 + 3;
                    if (iVar12 == 4) {
                      data_00[(long)iVar29 + 3] = (uchar)uVar15;
                      iVar16 = iVar29 + 4;
                    }
                    iVar29 = iVar16;
                    local_8918._0_4_ = (uint)local_8918 | uVar15;
                    iVar33 = iVar33 + 1;
                  } while (iVar33 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                iVar33 = 0;
                do {
                  puVar22 = s->img_buffer;
                  if (puVar22 < s->img_buffer_end) {
LAB_00126140:
                    s->img_buffer = puVar22 + 1;
                    uVar7 = *puVar22;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar22 = s->img_buffer;
                      goto LAB_00126140;
                    }
                    uVar7 = '\0';
                  }
                  data_00[(long)iVar29 + 2] = uVar7;
                  puVar22 = s->img_buffer;
                  if (puVar22 < s->img_buffer_end) {
LAB_00126188:
                    s->img_buffer = puVar22 + 1;
                    uVar7 = *puVar22;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar22 = s->img_buffer;
                      goto LAB_00126188;
                    }
                    uVar7 = '\0';
                  }
                  data_00[(long)iVar29 + 1] = uVar7;
                  puVar22 = s->img_buffer;
                  if (puVar22 < s->img_buffer_end) {
LAB_001261cd:
                    s->img_buffer = puVar22 + 1;
                    uVar7 = *puVar22;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar22 = s->img_buffer;
                      goto LAB_001261cd;
                    }
                    uVar7 = '\0';
                  }
                  data_00[iVar29] = uVar7;
                  bVar6 = 0xff;
                  if (bVar34) {
                    pbVar21 = s->img_buffer;
                    if (s->img_buffer_end <= pbVar21) {
                      if (s->read_from_callbacks == 0) {
                        bVar6 = 0;
                        goto LAB_00126225;
                      }
                      stbi__refill_buffer(s);
                      pbVar21 = s->img_buffer;
                    }
                    s->img_buffer = pbVar21 + 1;
                    bVar6 = *pbVar21;
                  }
LAB_00126225:
                  iVar16 = iVar29 + 3;
                  if (iVar12 == 4) {
                    data_00[(long)iVar29 + 3] = bVar6;
                    iVar16 = iVar29 + 4;
                  }
                  iVar29 = iVar16;
                  local_8918._0_4_ = (uint)local_8918 | bVar6;
                  iVar33 = iVar33 + 1;
                } while (iVar33 < (int)s->img_x);
              }
              stbi__skip(s,uVar26);
              iVar25 = iVar25 + 1;
            } while (iVar25 < (int)s->img_y);
            bVar3 = true;
          }
        }
        if (!bVar3) {
          return (void *)0x0;
        }
LAB_001262ab:
        if (((iVar12 == 4) && ((uint)local_8918 == 0)) &&
           (iVar8 = s->img_x * s->img_y * 4, -1 < iVar8 + -1)) {
          lVar23 = (ulong)(iVar8 - 4) + 7;
          do {
            data_00[lVar23 + -4] = 0xff;
            lVar23 = lVar23 + -4;
          } while (3 < lVar23);
        }
        if (0 < (int)uVar9) {
          uVar9 = (int)s->img_y >> 1;
          if (0 < (int)uVar9) {
            uVar26 = s->img_x * iVar12;
            uVar27 = (s->img_y - 1) * uVar26;
            uVar30 = 0;
            uVar32 = 0;
            do {
              if (0 < (int)uVar26) {
                uVar31 = 0;
                do {
                  uVar7 = data_00[uVar31 + uVar30];
                  data_00[uVar31 + uVar30] = data_00[uVar31 + uVar27];
                  data_00[uVar31 + uVar27] = uVar7;
                  uVar31 = uVar31 + 1;
                } while (uVar26 != uVar31);
              }
              uVar32 = uVar32 + 1;
              uVar27 = uVar27 - uVar26;
              uVar30 = (ulong)((int)uVar30 + uVar26);
            } while (uVar32 != uVar9);
          }
        }
        if ((iVar12 != req_comp && req_comp != 0) &&
           (data_00 = stbi__convert_format(data_00,iVar12,req_comp,s->img_x,s->img_y),
           data_00 == (uchar *)0x0)) {
          return (void *)0x0;
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return data_00;
        }
        return data_00;
      }
LAB_001264a0:
      pcVar17 = "outofmem";
      goto LAB_00125051;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar20 = s->img_buffer;
      goto LAB_0012508c;
    }
LAB_00125205:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar8 = stbi__gif_test(s);
    if (iVar8 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,two_back);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return data;
    }
    iVar8 = stbi__get16be(s);
    uVar9 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar9 | iVar8 << 0x10) != 0x38425053) {
      iVar8 = stbi__pic_test(s);
      if (iVar8 != 0) {
        pvVar18 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar18;
      }
      iVar8 = stbi__jpeg_test(s);
      if (iVar8 != 0) {
        pvVar18 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar18;
      }
      iVar8 = stbi__pnm_test(s);
      if (iVar8 != 0) {
        pvVar18 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar18;
      }
      iVar8 = stbi__hdr_test(s);
      if (iVar8 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar20 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar20;
      }
      iVar8 = stbi__tga_test(s);
      if (iVar8 != 0) {
        pvVar18 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar18;
      }
      pcVar17 = "unknown image type";
      goto LAB_00125051;
    }
    iVar8 = stbi__get16be(s);
    uVar9 = stbi__get16be(s);
    if ((uVar9 | iVar8 << 0x10) != 0x38425053) {
      pcVar17 = "not PSD";
      goto LAB_00125051;
    }
    iVar8 = stbi__get16be(s);
    if (iVar8 != 1) {
      pcVar17 = "wrong version";
      goto LAB_00125051;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00125544:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar8 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar8) goto LAB_00125544;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar8);
    }
    uVar9 = stbi__get16be(s);
    if (0x10 < uVar9) {
      pcVar17 = "wrong channel count";
      goto LAB_00125051;
    }
    iVar8 = stbi__get16be(s);
    iVar8 = iVar8 * 0x10000;
    iVar12 = stbi__get16be(s);
    uVar27 = iVar12 + iVar8;
    iVar11 = stbi__get16be(s);
    iVar14 = stbi__get16be(s);
    if ((int)uVar27 < 0x1000001) {
      iVar11 = iVar11 * 0x10000;
      uVar26 = iVar14 + iVar11;
      if ((int)uVar26 < 0x1000001) {
        iVar13 = stbi__get16be(s);
        if ((iVar13 != 8) && (iVar13 != 0x10)) {
          pcVar17 = "unsupported bit depth";
          goto LAB_00125051;
        }
        iVar25 = stbi__get16be(s);
        if (iVar25 != 3) {
          pcVar17 = "wrong color format";
          goto LAB_00125051;
        }
        sVar10 = stbi__get32be(s);
        stbi__skip(s,sVar10);
        sVar10 = stbi__get32be(s);
        stbi__skip(s,sVar10);
        sVar10 = stbi__get32be(s);
        stbi__skip(s,sVar10);
        uVar24 = stbi__get16be(s);
        if (1 < uVar24) {
          pcVar17 = "bad compression";
          goto LAB_00125051;
        }
        iVar25 = stbi__mad3sizes_valid(4,uVar26,uVar27,0);
        if (iVar25 != 0) {
          if (((bpc == 0x10) && (iVar13 == 0x10)) && (uVar24 == 0)) {
            psVar19 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar26,uVar27,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            psVar19 = (stbi__uint16 *)malloc((long)(int)(uVar27 * uVar26 * 4));
          }
          if (psVar19 != (stbi__uint16 *)0x0) {
            iVar25 = uVar26 * uVar27;
            if (uVar24 == 0) {
              iVar29 = (iVar12 + iVar8) * (iVar14 + iVar11);
              uVar30 = 0;
              local_8950 = psVar19;
              local_8918 = psVar19;
              do {
                if (uVar30 < uVar9) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar25) {
                      lVar23 = 0;
                      do {
                        iVar33 = stbi__get16be(s);
                        local_8950[lVar23 * 4] = (stbi__uint16)iVar33;
                        lVar23 = lVar23 + 1;
                      } while (iVar29 != (int)lVar23);
                    }
                  }
                  else if (iVar13 == 0x10) {
                    if (0 < iVar25) {
                      lVar23 = 0;
                      do {
                        iVar33 = stbi__get16be(s);
                        *(char *)(local_8918 + lVar23 * 2) = (char)((uint)iVar33 >> 8);
                        lVar23 = lVar23 + 1;
                      } while (iVar29 != (int)lVar23);
                    }
                  }
                  else if (0 < iVar25) {
                    lVar23 = 0;
                    do {
                      psVar20 = s->img_buffer;
                      if (psVar20 < s->img_buffer_end) {
LAB_001265e9:
                        s->img_buffer = psVar20 + 1;
                        sVar5 = *psVar20;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          psVar20 = s->img_buffer;
                          goto LAB_001265e9;
                        }
                        sVar5 = '\0';
                      }
                      *(stbi_uc *)(local_8918 + lVar23 * 2) = sVar5;
                      lVar23 = lVar23 + 1;
                    } while (iVar29 != (int)lVar23);
                  }
                }
                else if (iVar13 == 0x10 && bpc == 0x10) {
                  if (0 < iVar25) {
                    lVar23 = 0;
                    do {
                      local_8950[lVar23 * 4] = -(ushort)(uVar30 == 3);
                      lVar23 = lVar23 + 1;
                    } while (iVar29 != (int)lVar23);
                  }
                }
                else if (0 < iVar25) {
                  lVar23 = 0;
                  do {
                    *(char *)(local_8918 + lVar23 * 2) = -(uVar30 == 3);
                    lVar23 = lVar23 + 1;
                  } while (iVar29 != (int)lVar23);
                }
                uVar30 = uVar30 + 1;
                local_8918 = (stbi__uint16 *)((long)local_8918 + 1);
                local_8950 = local_8950 + 1;
              } while (uVar30 != 4);
            }
            else {
              stbi__skip(s,uVar9 * uVar27 * 2);
              uVar30 = 0;
              psVar28 = psVar19;
              do {
                if (uVar30 < uVar9) {
                  iVar13 = stbi__psd_decode_rle(s,(stbi_uc *)((long)psVar19 + uVar30),iVar25);
                  if (iVar13 == 0) {
                    free(psVar19);
                    pcVar17 = "corrupt";
                    goto LAB_00125051;
                  }
                }
                else if (0 < iVar25) {
                  lVar23 = 0;
                  do {
                    *(char *)(psVar28 + lVar23 * 2) = -(uVar30 == 3);
                    lVar23 = lVar23 + 1;
                  } while ((iVar12 + iVar8) * (iVar14 + iVar11) != (int)lVar23);
                }
                uVar30 = uVar30 + 1;
                psVar28 = (stbi__uint16 *)((long)psVar28 + 1);
              } while (uVar30 != 4);
            }
            if (3 < uVar9) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar25) {
                  uVar30 = 0;
                  do {
                    uVar1 = psVar19[uVar30 * 4 + 3];
                    if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                      fVar37 = 1.0 / ((float)uVar1 / 65535.0);
                      fVar36 = (1.0 - fVar37) * 65535.0;
                      psVar19[uVar30 * 4] =
                           (stbi__uint16)(int)((float)psVar19[uVar30 * 4] * fVar37 + fVar36);
                      psVar19[uVar30 * 4 + 1] =
                           (stbi__uint16)(int)((float)psVar19[uVar30 * 4 + 1] * fVar37 + fVar36);
                      psVar19[uVar30 * 4 + 2] =
                           (stbi__uint16)(int)((float)psVar19[uVar30 * 4 + 2] * fVar37 + fVar36);
                    }
                    uVar30 = uVar30 + 1;
                  } while ((uint)((iVar12 + iVar8) * (iVar14 + iVar11)) != uVar30);
                }
              }
              else if (0 < iVar25) {
                uVar30 = 0;
                do {
                  bVar6 = *(byte *)((long)psVar19 + uVar30 * 4 + 3);
                  if ((bVar6 != 0) && (bVar6 != 0xff)) {
                    fVar37 = 1.0 / ((float)bVar6 / 255.0);
                    fVar36 = (1.0 - fVar37) * 255.0;
                    *(char *)(psVar19 + uVar30 * 2) =
                         (char)(int)((float)(byte)psVar19[uVar30 * 2] * fVar37 + fVar36);
                    *(char *)((long)psVar19 + uVar30 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)psVar19 + uVar30 * 4 + 1) * fVar37 +
                                    fVar36);
                    *(char *)(psVar19 + uVar30 * 2 + 1) =
                         (char)(int)((float)(byte)psVar19[uVar30 * 2 + 1] * fVar37 + fVar36);
                  }
                  uVar30 = uVar30 + 1;
                } while ((uint)((iVar12 + iVar8) * (iVar14 + iVar11)) != uVar30);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                psVar19 = stbi__convert_format16(psVar19,4,req_comp,uVar26,uVar27);
              }
              else {
                psVar19 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)psVar19,4,req_comp,uVar26,uVar27);
              }
              if (psVar19 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar27;
            *x = uVar26;
            return psVar19;
          }
          goto LAB_001264a0;
        }
      }
    }
  }
LAB_00125c9a:
  pcVar17 = "too large";
LAB_00125051:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}